

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O3

size_t tinyusdz::Usd_IntegerCompression::GetCompressedBufferSize(size_t numInts)

{
  size_t sVar1;
  
  if (numInts != 0) {
    sVar1 = LZ4Compression::GetCompressedBufferSize((numInts * 2 + 7 >> 3) + numInts * 4 + 4);
    return sVar1;
  }
  sVar1 = LZ4Compression::GetCompressedBufferSize(0);
  return sVar1;
}

Assistant:

constexpr size_t
_GetEncodedBufferSize(size_t numInts)
{
    // Calculate encoded integer size.
    return numInts ?
        /* commonValue */ (sizeof(Int)) +
        /* numCodesBytes */ ((numInts * 2 + 7) / 8) +
        /* maxIntBytes */ (numInts * sizeof(Int))
        : 0;
}